

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::saturating_narrow<unsigned_short>(Literal *__return_storage_ptr__,type val)

{
  unsigned_short uVar1;
  undefined4 local_14;
  type val_local;
  
  uVar1 = std::numeric_limits<unsigned_short>::max();
  if ((int)(uint)uVar1 < val) {
    uVar1 = std::numeric_limits<unsigned_short>::max();
    local_14 = (uint)uVar1;
  }
  else {
    uVar1 = std::numeric_limits<unsigned_short>::min();
    local_14 = val;
    if (val < (int)(uint)uVar1) {
      uVar1 = std::numeric_limits<unsigned_short>::min();
      local_14 = (uint)uVar1;
    }
  }
  Literal::Literal(__return_storage_ptr__,local_14);
  return __return_storage_ptr__;
}

Assistant:

Literal saturating_narrow(
  typename TwiceWidth<typename std::make_signed<T>::type>::type val) {
  using WideT = typename TwiceWidth<typename std::make_signed<T>::type>::type;
  if (val > WideT(std::numeric_limits<T>::max())) {
    val = std::numeric_limits<T>::max();
  } else if (val < WideT(std::numeric_limits<T>::min())) {
    val = std::numeric_limits<T>::min();
  }
  return Literal(int32_t(val));
}